

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> * __thiscall
libtorrent::torrent_info::similar_torrents
          (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           *__return_storage_ptr__,torrent_info *this)

{
  pointer *ppdVar1;
  int *piVar2;
  pointer pdVar3;
  iterator __position;
  undefined8 uVar4;
  int *st;
  int *piVar5;
  digest32<160L> *st_1;
  pointer __args;
  char *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_owned_similar_torrents).
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_owned_similar_torrents).
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333 +
             ((long)(this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2));
  piVar5 = (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar2) {
    do {
      local_30 = (this->m_info_section).px + *piVar5;
      ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
      emplace_back<char*>((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                           *)__return_storage_ptr__,&local_30);
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar2);
  }
  pdVar3 = (this->m_owned_similar_torrents).
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->m_owned_similar_torrents).
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pdVar3; __args = __args + 1) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
      _M_realloc_insert<libtorrent::digest32<160l>const&>
                ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>> *)
                 __return_storage_ptr__,__position,__args);
    }
    else {
      ((__position._M_current)->m_number)._M_elems[4] = (__args->m_number)._M_elems[4];
      uVar4 = *(undefined8 *)((__args->m_number)._M_elems + 2);
      *(undefined8 *)((__position._M_current)->m_number)._M_elems =
           *(undefined8 *)(__args->m_number)._M_elems;
      *(undefined8 *)(((__position._M_current)->m_number)._M_elems + 2) = uVar4;
      ppdVar1 = &(__return_storage_ptr__->
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppdVar1 = *ppdVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sha1_hash> torrent_info::similar_torrents() const
	{
		std::vector<sha1_hash> ret;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		ret.reserve(m_similar_torrents.size() + m_owned_similar_torrents.size());

		for (auto const& st : m_similar_torrents)
			ret.emplace_back(m_info_section.get() + st);

		for (auto const& st : m_owned_similar_torrents)
			ret.push_back(st);
#endif

		return ret;
	}